

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_set.h
# Opt level: O2

bool __thiscall xla::OrderedSet<int>::Insert(OrderedSet<int> *this,int value)

{
  pair<std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>,_bool> pVar1;
  int local_1c;
  int local_18;
  undefined4 local_14;
  
  local_14 = (undefined4)
             ((ulong)((long)(this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_1c = value;
  local_18 = value;
  pVar1 = std::
          _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<int_const,int>>
                    ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->value_to_index_,&local_18);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->value_sequence_,&local_1c);
  }
  return (bool)(pVar1.second & 1);
}

Assistant:

bool Insert(T value) {
    bool new_insertion =
      value_to_index_.insert({value, static_cast<int32_t>(value_sequence_.size())}).second;
    if (new_insertion) {
      value_sequence_.push_back(value);
    }
    return new_insertion;
  }